

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::DefParamSymbol::serializeTo(DefParamSymbol *this,ASTSerializer *serializer)

{
  Symbol *pSVar1;
  ConstantValue *__n;
  DefParamSymbol *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  Symbol *t;
  Symbol *in_stack_000000a8;
  ASTSerializer *in_stack_000000b0;
  undefined1 in_stack_000000b8 [16];
  DefParamSymbol *in_stack_ffffffffffffffb0;
  DefParamSymbol *in_stack_ffffffffffffffb8;
  undefined4 local_38;
  undefined8 local_30;
  
  pSVar1 = getTarget(in_stack_ffffffffffffffb0);
  if (pSVar1 != (Symbol *)0x0) {
    in_stack_ffffffffffffffb8 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
    ASTSerializer::writeLink(in_stack_000000b0,(string_view)in_stack_000000b8,in_stack_000000a8);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,(char *)in_stack_ffffffffffffffb8);
  __n = getValue(in_RSI);
  ASTSerializer::write((ASTSerializer *)in_RSI,local_38,local_30,(size_t)__n);
  return;
}

Assistant:

void DefParamSymbol::serializeTo(ASTSerializer& serializer) const {
    if (auto t = getTarget())
        serializer.writeLink("target", *t);
    serializer.write("value", getValue());
}